

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bcatcstr(bstring b,char *s)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  
  iVar5 = -1;
  if ((b != (bstring)0x0) && (puVar4 = b->data, puVar4 != (uchar *)0x0)) {
    uVar2 = b->slen;
    if ((-1 < (int)uVar2) &&
       ((iVar3 = b->mlen, (int)uVar2 <= iVar3 && (s != (char *)0x0 && iVar3 != 0)))) {
      uVar6 = 0;
      uVar8 = (ulong)(iVar3 - uVar2);
      if ((int)(iVar3 - uVar2) < 1) {
        uVar8 = uVar6;
      }
      while( true ) {
        if ((int)uVar8 == (int)uVar6) {
          b->slen = b->slen + (int)uVar8;
          sVar7 = strlen(s + uVar6);
          iVar5 = bcatblk(b,s + uVar6,(int)sVar7);
          return iVar5;
        }
        uVar1 = s[uVar6];
        puVar4[uVar6 + uVar2] = uVar1;
        if (uVar1 == '\0') break;
        uVar6 = uVar6 + 1;
      }
      b->slen = b->slen + (int)uVar6;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int bcatcstr (bstring b, const char * s) {
char * d;
int i, l;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL) return BSTR_ERR;

	/* Optimistically concatenate directly */
	l = b->mlen - b->slen;
	d = (char *) &b->data[b->slen];
	for (i=0; i < l; i++) {
		if ((*d++ = *s++) == '\0') {
			b->slen += i;
			return BSTR_OK;
		}
	}
	b->slen += i;

	/* Need to explicitely resize and concatenate tail */
	return bcatblk (b, (const void *) s, (int) strlen (s));
}